

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_wallmarks::load(xr_level_wallmarks *this,xr_reader *r)

{
  xr_reader *pxVar1;
  uint32_t uVar2;
  xr_reader *local_20;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_wallmarks *this_local;
  
  s = r;
  r_local = (xr_reader *)this;
  local_20 = xr_reader::open_chunk(r,1);
  if (local_20 == (xr_reader *)0x0) {
    local_20 = xr_reader::open_chunk(s,0);
  }
  pxVar1 = local_20;
  uVar2 = xr_reader::r_u32(local_20);
  xr_reader::r_seq<std::vector<xray_re::wm_slot*,std::allocator<xray_re::wm_slot*>>,read_wm_slot>
            (pxVar1,uVar2,this);
  xr_reader::close_chunk(s,&local_20);
  return;
}

Assistant:

void xr_level_wallmarks::load(xr_reader& r)
{
	xr_reader* s = r.open_chunk(1);
	
	//before 1935 chunk_id = 0
	if (s == 0)
		s = r.open_chunk(0);

	s->r_seq(s->r_u32(), m_slots, read_wm_slot());
	r.close_chunk(s);
}